

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-arith-cwise.cc
# Opt level: O0

int __thiscall
dynet::CwiseMultiply::autobatch_sig(CwiseMultiply *this,ComputationGraph *cg,SigMap *sm)

{
  vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *this_00;
  bool bVar1;
  const_reference pvVar2;
  vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *in_RSI;
  long in_RDI;
  SigHash *in_stack_00000020;
  Sig s;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar3;
  SigHash local_20 [2];
  vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *local_10;
  
  local_10 = in_RSI;
  SigHash::SigHash(local_20,0x13);
  this_00 = local_10;
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8),0);
  std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::operator[](this_00,(ulong)*pvVar2);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8),1);
  std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::operator[](local_10,(ulong)*pvVar2);
  bVar1 = dynet::operator==((Dim *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                            (Dim *)0x9d13be);
  if (bVar1) {
    iVar3 = SigLinearSortedMap<dynet::SigHash>::get_idx
                      ((SigLinearSortedMap<dynet::SigHash> *)s,in_stack_00000020);
  }
  else {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int CwiseMultiply::autobatch_sig(const ComputationGraph & cg, SigMap &sm) const {
  // TODO: This does not handle the case where dimensions differ
  Sig s(nt::cmult);
  return cg.nodes[args[0]]->dim == cg.nodes[args[1]]->dim ? sm.get_idx(s) : 0;
}